

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O1

void __thiscall
duckdb::ModeState<unsigned_int,_duckdb::ModeStandard<unsigned_int>_>::ModeRm
          (ModeState<unsigned_int,_duckdb::ModeStandard<unsigned_int>_> *this,idx_t frame)

{
  DataChunk *result;
  ColumnDataScanState *state;
  uint *puVar1;
  size_t sVar2;
  idx_t iVar3;
  reference pvVar4;
  mapped_type *pmVar5;
  
  state = this->scan;
  if ((state->next_row_index <= frame) || (frame < state->current_row_index)) {
    result = &this->page;
    ColumnDataCollection::Seek(this->inputs,frame,state,result);
    pvVar4 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    this->data = (uint *)pvVar4->data;
    pvVar4 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    FlatVector::VerifyFlatVector(pvVar4);
    this->validity = &pvVar4->validity;
  }
  iVar3 = this->scan->current_row_index;
  puVar1 = this->data;
  pmVar5 = ::std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_duckdb::ModeAttr>,_std::allocator<std::pair<const_unsigned_int,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_duckdb::ModeAttr>,_std::allocator<std::pair<const_unsigned_int,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this->frequency_map,puVar1 + (uint)((int)frame - (int)iVar3));
  sVar2 = pmVar5->count;
  this->nonzero = this->nonzero - (ulong)(sVar2 == 1);
  pmVar5->count = sVar2 - 1;
  if ((this->count == sVar2) && (puVar1[(uint)((int)frame - (int)iVar3)] == *this->mode)) {
    this->valid = false;
  }
  return;
}

Assistant:

void ModeRm(idx_t frame) {
		const auto &key = GetCell(frame);
		auto &attr = (*frequency_map)[key];
		auto old_count = attr.count;
		nonzero -= size_t(old_count == 1);

		attr.count -= 1;
		if (count == old_count && key == *mode) {
			valid = false;
		}
	}